

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmstradCPC.cpp
# Opt level: O0

void __thiscall AmstradCPC::KeyboardState::Joystick::~Joystick(Joystick *this)

{
  Joystick *this_local;
  
  ~Joystick(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

Joystick(uint8_t &state) :
					ConcreteJoystick({
						Input(Input::Up),
						Input(Input::Down),
						Input(Input::Left),
						Input(Input::Right),
						Input(Input::Fire, 0),
						Input(Input::Fire, 1),
					}),
					state_(state) {}